

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
 __thiscall
Lib::
Stack<std::unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
::pop(Stack<std::unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
      *this)

{
  long lVar1;
  long in_RSI;
  
  lVar1 = *(long *)(in_RSI + 0x10);
  *(long *)(in_RSI + 0x10) = lVar1 + -8;
  this->_capacity = *(size_t *)(lVar1 + -8);
  *(undefined8 *)(lVar1 + -8) = 0;
  std::
  unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ::~unique_ptr(*(unique_ptr<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                  **)(in_RSI + 0x10));
  return (__uniq_ptr_data<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>,_true,_true>
          )(__uniq_ptr_data<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>,_true,_true>
            )this;
}

Assistant:

inline
  C pop()
  {
    ASS(_cursor > _stack);
    _cursor--;

    C res = std::move(*_cursor);
    _cursor->~C();

    return res;
  }